

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O2

void ncnn::cubic_coeffs(int w,int outw,int *xofs,float *alpha,int align_corner)

{
  float fVar1;
  int iVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int local_64;
  
  if (align_corner == 0) {
    fVar1 = (float)w / (float)outw;
  }
  else {
    fVar1 = (float)(w + -1) / (float)(outw + -1);
  }
  local_64 = w + -1;
  uVar4 = 0;
  uVar5 = (ulong)(uint)outw;
  if (outw < 1) {
    uVar5 = uVar4;
  }
  pfVar6 = alpha + 3;
  do {
    if (uVar5 == uVar4) {
      return;
    }
    fVar9 = ((float)(int)uVar4 + 0.5) * fVar1 + -0.5;
    if (align_corner != 0) {
      fVar9 = (float)(int)uVar4 * fVar1;
    }
    fVar7 = floorf(fVar9);
    iVar2 = (int)fVar7;
    fVar9 = fVar9 - (float)(int)fVar7;
    fVar7 = fVar9 + 1.0;
    fVar8 = 1.0 - fVar9;
    fVar7 = (3.75 - fVar7 * 0.75) * fVar7 * fVar7 + fVar7 * -6.0 + 3.0;
    fVar9 = (fVar9 * 1.25 + -2.25) * fVar9 * fVar9 + 1.0;
    *(ulong *)(pfVar6 + -3) = CONCAT44(fVar9,fVar7);
    fVar8 = (fVar8 * 1.25 + -2.25) * fVar8 * fVar8;
    pfVar6[-1] = fVar8 + 1.0;
    *pfVar6 = -(fVar8 + fVar7 + fVar9);
    if (iVar2 < 0) {
      pfVar3 = alpha + uVar4 * 4 + 3;
      fVar7 = 1.0 - *pfVar6;
      pfVar6[-3] = fVar7;
      pfVar6[-2] = *pfVar6;
      pfVar6[-1] = 0.0;
LAB_002703f2:
      *pfVar3 = 0.0;
      iVar2 = 1;
    }
    else if (iVar2 == 0) {
      fVar7 = fVar7 + pfVar6[-2];
      pfVar6[-3] = fVar7;
      *(undefined8 *)(pfVar6 + -2) = *(undefined8 *)(pfVar6 + -1);
      pfVar3 = pfVar6;
      goto LAB_002703f2;
    }
    if (iVar2 == w + -2) {
      *pfVar6 = *pfVar6 + pfVar6[-1];
      pfVar6[-1] = pfVar6[-2];
      pfVar6[-2] = fVar7;
LAB_00270441:
      pfVar6[-3] = 0.0;
      iVar2 = w + -3;
    }
    else if (local_64 <= iVar2) {
      *pfVar6 = 1.0 - fVar7;
      pfVar6[-1] = fVar7;
      pfVar6[-2] = 0.0;
      goto LAB_00270441;
    }
    xofs[uVar4] = iVar2;
    uVar4 = uVar4 + 1;
    pfVar6 = pfVar6 + 4;
  } while( true );
}

Assistant:

static void cubic_coeffs(int w, int outw, int* xofs, float* alpha, int align_corner)
{
    double scale = (double)w / outw;
    if (align_corner)
    {
        scale = (double)(w - 1) / (outw - 1);
    }

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        if (align_corner)
        {
            fx = static_cast<float>(dx * scale);
        }

        int sx = static_cast<int>(floor(fx));
        fx -= sx;

        interpolate_cubic(fx, alpha + dx * 4);

        if (sx <= -1)
        {
            sx = 1;
            alpha[dx * 4 + 0] = 1.f - alpha[dx * 4 + 3];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 3];
            alpha[dx * 4 + 2] = 0.f;
            alpha[dx * 4 + 3] = 0.f;
        }
        if (sx == 0)
        {
            sx = 1;
            alpha[dx * 4 + 0] = alpha[dx * 4 + 0] + alpha[dx * 4 + 1];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 2];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 3];
            alpha[dx * 4 + 3] = 0.f;
        }
        if (sx == w - 2)
        {
            sx = w - 3;
            alpha[dx * 4 + 3] = alpha[dx * 4 + 2] + alpha[dx * 4 + 3];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 1];
            alpha[dx * 4 + 1] = alpha[dx * 4 + 0];
            alpha[dx * 4 + 0] = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 3;
            alpha[dx * 4 + 3] = 1.f - alpha[dx * 4 + 0];
            alpha[dx * 4 + 2] = alpha[dx * 4 + 0];
            alpha[dx * 4 + 1] = 0.f;
            alpha[dx * 4 + 0] = 0.f;
        }

        xofs[dx] = sx;
    }
}